

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O2

int llhttp__internal_execute(llhttp__internal_t *state,char *p,char *endp)

{
  llparse_state_t lVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = state->error;
  if (state->error == 0) {
    if (state->_span_pos0 != (void *)0x0) {
      state->_span_pos0 = p;
    }
    lVar1 = llhttp__internal__run(state,(uchar *)p,(uchar *)endp);
    if (lVar1 == s_error) {
      iVar3 = state->error;
    }
    else {
      state->_current = (void *)(ulong)lVar1;
      iVar3 = 0;
      if (state->_span_pos0 != (void *)0x0) {
        iVar2 = (*(code *)state->_span_cb0)(state,state->_span_pos0,endp);
        if (iVar2 != 0) {
          state->error = iVar2;
          state->error_pos = endp;
          iVar3 = iVar2;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int llhttp__internal_execute(llhttp__internal_t* state, const char* p, const char* endp) {
  llparse_state_t next;

  /* check lingering errors */
  if (state->error != 0) {
    return state->error;
  }

  /* restart spans */
  if (state->_span_pos0 != NULL) {
    state->_span_pos0 = (void*) p;
  }
  
  next = llhttp__internal__run(state, (const unsigned char*) p, (const unsigned char*) endp);
  if (next == s_error) {
    return state->error;
  }
  state->_current = (void*) (intptr_t) next;

  /* execute spans */
  if (state->_span_pos0 != NULL) {
    int error;
  
    error = ((llhttp__internal__span_cb) state->_span_cb0)(state, state->_span_pos0, (const char*) endp);
    if (error != 0) {
      state->error = error;
      state->error_pos = endp;
      return error;
    }
  }
  
  return 0;
}